

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateArrayIndex(ExpressionEvalContext *ctx,ExprArrayIndex *expression)

{
  uchar *puVar1;
  long lVar2;
  SynBase *pSVar3;
  ExprArrayIndex *ctx_00;
  bool bVar4;
  StackFrame **ppSVar5;
  ExprBase *pEVar6;
  TypeUnsizedArray *pTVar7;
  ExprMemoryLiteral *memory_00;
  TypeRef *pTVar8;
  ExprBase *node;
  ExprIntegerLiteral *pEVar9;
  ExprPointerLiteral *pEVar10;
  TypeArray *pTVar11;
  ExprPointerLiteral *shifted;
  uchar *targetPtr;
  ExprPointerLiteral *ptr;
  TypeArray *arrayType;
  TypeRef *refType;
  ExprPointerLiteral *shifted_1;
  uchar *targetPtr_1;
  ExprPointerLiteral *ptr_1;
  ExprIntegerLiteral *size;
  ExprBase *value_1;
  ExprMemoryLiteral *memory;
  TypeUnsizedArray *arrayType_1;
  longlong result;
  ExprBase *index;
  ExprBase *value;
  ExprArrayIndex *expression_local;
  ExpressionEvalContext *ctx_local;
  
  value = &expression->super_ExprBase;
  expression_local = (ExprArrayIndex *)ctx;
  bVar4 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::empty(&ctx->stackFrames);
  if ((!bVar4) &&
     (ppSVar5 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back
                          ((SmallArray<ExpressionEvalContext::StackFrame_*,_32U> *)
                           &(expression_local->super_ExprBase).next), (*ppSVar5)->targetYield != 0))
  {
    pEVar6 = &ExpressionContext::get<ExprVoid>
                        ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase)->
              super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)pEVar6,value->source,
                       (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1137]);
    return pEVar6;
  }
  bVar4 = AddInstruction((ExpressionEvalContext *)expression_local);
  if (bVar4) {
    index = Evaluate((ExpressionEvalContext *)expression_local,(ExprBase *)value[1]._vptr_ExprBase);
    if (index == (ExprBase *)0x0) {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
    else {
      result = (longlong)
               Evaluate((ExpressionEvalContext *)expression_local,*(ExprBase **)&value[1].typeID);
      if ((ExprBase *)result == (ExprBase *)0x0) {
        ctx_local = (ExpressionEvalContext *)0x0;
      }
      else {
        bVar4 = TryTakeLong((ExprBase *)result,(longlong *)&arrayType_1);
        if (bVar4) {
          pTVar7 = getType<TypeUnsizedArray>(index->type);
          if (pTVar7 == (TypeUnsizedArray *)0x0) {
            pTVar8 = getType<TypeRef>(index->type);
            if (pTVar8 == (TypeRef *)0x0) {
              __assert_fail("refType",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                            ,0x66d,
                            "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)"
                           );
            }
            pTVar11 = getType<TypeArray>(pTVar8->subType);
            if (pTVar11 == (TypeArray *)0x0) {
              __assert_fail("arrayType",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                            ,0x671,
                            "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)"
                           );
            }
            bVar4 = isType<ExprNullptrLiteral>(index);
            if (bVar4) {
              ctx_local = (ExpressionEvalContext *)
                          Report((ExpressionEvalContext *)expression_local,
                                 "ERROR: array index of a null array");
            }
            else if (((long)arrayType_1 < 0) || (pTVar11->length <= (long)arrayType_1)) {
              ctx_local = (ExpressionEvalContext *)
                          ReportCritical((ExpressionEvalContext *)expression_local,
                                         "ERROR: array index out of bounds");
            }
            else {
              pEVar10 = getType<ExprPointerLiteral>(index);
              if (pEVar10 == (ExprPointerLiteral *)0x0) {
                __assert_fail("ptr",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                              ,0x67b,
                              "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)"
                             );
              }
              if (pEVar10->end <
                  pEVar10->ptr + pTVar11->subType->size + (long)arrayType_1 * pTVar11->subType->size
                 ) {
                __assert_fail("ptr->ptr + result * arrayType->subType->size + arrayType->subType->size <= ptr->end"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                              ,0x67c,
                              "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)"
                             );
              }
              puVar1 = pEVar10->ptr;
              lVar2 = pTVar11->subType->size;
              pEVar10 = ExpressionContext::get<ExprPointerLiteral>
                                  ((ExpressionContext *)
                                   (expression_local->super_ExprBase)._vptr_ExprBase);
              pSVar3 = value->source;
              pTVar8 = ExpressionContext::GetReferenceType
                                 ((ExpressionContext *)
                                  (expression_local->super_ExprBase)._vptr_ExprBase,pTVar11->subType
                                 );
              ExprPointerLiteral::ExprPointerLiteral
                        (pEVar10,pSVar3,&pTVar8->super_TypeBase,puVar1 + (long)arrayType_1 * lVar2,
                         puVar1 + (long)arrayType_1 * lVar2 + pTVar11->subType->size);
              ctx_local = (ExpressionEvalContext *)CheckType(value,&pEVar10->super_ExprBase);
            }
          }
          else {
            memory_00 = getType<ExprMemoryLiteral>(index);
            ctx_00 = expression_local;
            if (memory_00 == (ExprMemoryLiteral *)0x0) {
              __assert_fail("memory",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                            ,0x64e,
                            "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)"
                           );
            }
            pTVar8 = ExpressionContext::GetReferenceType
                               ((ExpressionContext *)
                                (expression_local->super_ExprBase)._vptr_ExprBase,pTVar7->subType);
            pEVar6 = CreateExtract((ExpressionEvalContext *)ctx_00,memory_00,0,
                                   &pTVar8->super_TypeBase);
            if (pEVar6 == (ExprBase *)0x0) {
              ctx_local = (ExpressionEvalContext *)0x0;
            }
            else {
              bVar4 = isType<ExprNullptrLiteral>(pEVar6);
              if (bVar4) {
                ctx_local = (ExpressionEvalContext *)
                            Report((ExpressionEvalContext *)expression_local,
                                   "ERROR: array index of a null array");
              }
              else {
                node = CreateExtract((ExpressionEvalContext *)expression_local,memory_00,8,
                                     (TypeBase *)
                                     (expression_local->super_ExprBase)._vptr_ExprBase[0x113b]);
                pEVar9 = getType<ExprIntegerLiteral>(node);
                if (pEVar9 == (ExprIntegerLiteral *)0x0) {
                  ctx_local = (ExpressionEvalContext *)0x0;
                }
                else if (((long)arrayType_1 < 0) || (pEVar9->value <= (long)arrayType_1)) {
                  ctx_local = (ExpressionEvalContext *)
                              ReportCritical((ExpressionEvalContext *)expression_local,
                                             "ERROR: array index out of bounds");
                }
                else {
                  pEVar10 = getType<ExprPointerLiteral>(pEVar6);
                  if (pEVar10 == (ExprPointerLiteral *)0x0) {
                    __assert_fail("ptr",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                                  ,0x662,
                                  "ExprBase *EvaluateArrayIndex(ExpressionEvalContext &, ExprArrayIndex *)"
                                 );
                  }
                  puVar1 = pEVar10->ptr;
                  lVar2 = pTVar7->subType->size;
                  pEVar10 = ExpressionContext::get<ExprPointerLiteral>
                                      ((ExpressionContext *)
                                       (expression_local->super_ExprBase)._vptr_ExprBase);
                  pSVar3 = value->source;
                  pTVar8 = ExpressionContext::GetReferenceType
                                     ((ExpressionContext *)
                                      (expression_local->super_ExprBase)._vptr_ExprBase,
                                      pTVar7->subType);
                  ExprPointerLiteral::ExprPointerLiteral
                            (pEVar10,pSVar3,&pTVar8->super_TypeBase,
                             puVar1 + (long)arrayType_1 * lVar2,
                             puVar1 + (long)arrayType_1 * lVar2 + pTVar7->subType->size);
                  ctx_local = (ExpressionEvalContext *)CheckType(value,&pEVar10->super_ExprBase);
                }
              }
            }
          }
        }
        else {
          ctx_local = (ExpressionEvalContext *)
                      Report((ExpressionEvalContext *)expression_local,
                             "ERROR: failed to evaluate array index");
        }
      }
    }
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateArrayIndex(ExpressionEvalContext &ctx, ExprArrayIndex *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *value = Evaluate(ctx, expression->value);

	if(!value)
		return NULL;

	ExprBase *index = Evaluate(ctx, expression->index);

	if(!index)
		return NULL;

	long long result;
	if(!TryTakeLong(index, result))
		return Report(ctx, "ERROR: failed to evaluate array index");

	if(TypeUnsizedArray *arrayType = getType<TypeUnsizedArray>(value->type))
	{
		ExprMemoryLiteral *memory = getType<ExprMemoryLiteral>(value);

		assert(memory);

		ExprBase *value = CreateExtract(ctx, memory, 0, ctx.ctx.GetReferenceType(arrayType->subType));

		if(!value)
			return NULL;

		if(isType<ExprNullptrLiteral>(value))
			return Report(ctx, "ERROR: array index of a null array");

		ExprIntegerLiteral *size = getType<ExprIntegerLiteral>(CreateExtract(ctx, memory, sizeof(void*), ctx.ctx.typeInt));

		if(!size)
			return NULL;

		if(result < 0 || result >= size->value)
			return ReportCritical(ctx, "ERROR: array index out of bounds");

		ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(value);

		assert(ptr);

		unsigned char *targetPtr = ptr->ptr + result * arrayType->subType->size;

		ExprPointerLiteral *shifted = new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(arrayType->subType), targetPtr, targetPtr + arrayType->subType->size);

		return CheckType(expression, shifted);
	}

	TypeRef *refType = getType<TypeRef>(value->type);

	assert(refType);

	TypeArray *arrayType = getType<TypeArray>(refType->subType);

	assert(arrayType);

	if(isType<ExprNullptrLiteral>(value))
		return Report(ctx, "ERROR: array index of a null array");

	if(result < 0 || result >= arrayType->length)
		return ReportCritical(ctx, "ERROR: array index out of bounds");

	ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(value);

	assert(ptr);
	assert(ptr->ptr + result * arrayType->subType->size + arrayType->subType->size <= ptr->end);

	unsigned char *targetPtr = ptr->ptr + result * arrayType->subType->size;

	ExprPointerLiteral *shifted = new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(arrayType->subType), targetPtr, targetPtr + arrayType->subType->size);

	return CheckType(expression, shifted);
}